

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmConstant *
anon_unknown.dwarf_20a43d::CreateAlloca
          (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,char *suffix,
          bool trackUsers)

{
  uint uVar1;
  uint uniqueId;
  FunctionData *pFVar2;
  ScopeData *scope;
  Allocator *allocator;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeRef *structType;
  VmConstant *pVVar5;
  ScopeData **ppSVar6;
  InplaceStr name;
  VariableData *variable;
  VariableData *this;
  
  pFVar2 = module->currentFunction->function;
  ppSVar6 = &pFVar2->functionScope;
  if (pFVar2 == (FunctionData *)0x0) {
    ppSVar6 = &ctx->globalScope;
  }
  scope = *ppSVar6;
  uVar1 = ctx->unnamedVariableCount;
  ctx->unnamedVariableCount = uVar1 + 1;
  name = GetTemporaryName(ctx,uVar1,suffix);
  iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x50);
  SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar3),name);
  iVar4 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x170);
  this = (VariableData *)CONCAT44(extraout_var_00,iVar4);
  uVar1 = type->alignment;
  uniqueId = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uniqueId + 1;
  VariableData::VariableData
            (this,ctx->allocator,(SynBase *)0x0,scope,uVar1,type,
             (SynIdentifier *)CONCAT44(extraout_var,iVar3),0,uniqueId);
  this->isVmAlloca = true;
  this->offset = 0xffffffff;
  allocator = module->allocator;
  variable = this;
  structType = ExpressionContext::GetReferenceType(ctx,this->type);
  pVVar5 = CreateConstantPointer(allocator,source,0,this,&structType->super_TypeBase,trackUsers);
  SmallArray<VariableData_*,_4U>::push_back(&module->currentFunction->allocas,&variable);
  return pVVar5;
}

Assistant:

VmConstant* CreateAlloca(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, const char *suffix, bool trackUsers)
	{
		ScopeData *scope = module->currentFunction->function ? module->currentFunction->function->functionScope : ctx.globalScope;

		InplaceStr name = GetTemporaryName(ctx, ctx.unnamedVariableCount++, suffix);

		SynIdentifier *nameIdentifier = new (module->get<SynIdentifier>()) SynIdentifier(name);

		VariableData *variable = new (module->get<VariableData>()) VariableData(ctx.allocator, NULL, scope, type->alignment, type, nameIdentifier, 0, ctx.uniqueVariableId++);

		variable->isVmAlloca = true;
		variable->offset = ~0u;

		VmConstant *value = CreateConstantPointer(module->allocator, source, 0, variable, ctx.GetReferenceType(variable->type), trackUsers);

		module->currentFunction->allocas.push_back(variable);

		return value;
	}